

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

void __thiscall ncnn::ConvolutionDepthWise::ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  Layer::Layer(&this->super_Layer);
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_006558b0;
  (this->activation_params).cstep = 0;
  (this->top_blob_int8_scales).cstep = 0;
  (this->activation_params).data = (void *)0x0;
  (this->activation_params).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->activation_params).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->activation_params).elemsize + 4) = 0;
  (this->activation_params).allocator = (Allocator *)0x0;
  (this->activation_params).dims = 0;
  (this->activation_params).w = 0;
  (this->activation_params).w = 0;
  (this->activation_params).h = 0;
  (this->activation_params).d = 0;
  (this->activation_params).c = 0;
  (this->weight_data).data = (void *)0x0;
  (this->weight_data).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
  (this->weight_data).allocator = (Allocator *)0x0;
  (this->weight_data).dims = 0;
  (this->weight_data).w = 0;
  (this->weight_data).w = 0;
  (this->weight_data).h = 0;
  (this->weight_data).d = 0;
  (this->weight_data).c = 0;
  (this->weight_data).cstep = 0;
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).elempack = 0;
  (this->bias_data).allocator = (Allocator *)0x0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).d = 0;
  (this->bias_data).c = 0;
  (this->bias_data).cstep = 0;
  (this->weight_data_int8_scales).data = (void *)0x0;
  (this->weight_data_int8_scales).refcount = (int *)0x0;
  (this->weight_data_int8_scales).elemsize = 0;
  (this->weight_data_int8_scales).elempack = 0;
  (this->weight_data_int8_scales).w = 0;
  (this->weight_data_int8_scales).h = 0;
  (this->weight_data_int8_scales).d = 0;
  (this->weight_data_int8_scales).c = 0;
  (this->weight_data_int8_scales).allocator = (Allocator *)0x0;
  (this->weight_data_int8_scales).dims = 0;
  (this->weight_data_int8_scales).w = 0;
  (this->bottom_blob_int8_scales).elempack = 0;
  (this->bottom_blob_int8_scales).refcount = (int *)0x0;
  (this->bottom_blob_int8_scales).elemsize = 0;
  (this->weight_data_int8_scales).cstep = 0;
  (this->bottom_blob_int8_scales).data = (void *)0x0;
  (this->bottom_blob_int8_scales).w = 0;
  (this->bottom_blob_int8_scales).h = 0;
  (this->bottom_blob_int8_scales).d = 0;
  (this->bottom_blob_int8_scales).c = 0;
  (this->bottom_blob_int8_scales).allocator = (Allocator *)0x0;
  (this->bottom_blob_int8_scales).dims = 0;
  (this->bottom_blob_int8_scales).w = 0;
  (this->top_blob_int8_scales).elempack = 0;
  (this->top_blob_int8_scales).refcount = (int *)0x0;
  (this->top_blob_int8_scales).elemsize = 0;
  (this->bottom_blob_int8_scales).cstep = 0;
  (this->top_blob_int8_scales).data = (void *)0x0;
  (this->top_blob_int8_scales).w = 0;
  (this->top_blob_int8_scales).h = 0;
  (this->top_blob_int8_scales).d = 0;
  (this->top_blob_int8_scales).c = 0;
  (this->top_blob_int8_scales).allocator = (Allocator *)0x0;
  (this->top_blob_int8_scales).dims = 0;
  (this->top_blob_int8_scales).w = 0;
  (this->super_Layer).one_blob_only = true;
  (this->super_Layer).support_inplace = false;
  return;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;
}